

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O1

void duckdb::Date::ExtractISOYearWeek(date_t date,int32_t *year,int32_t *week)

{
  date_t dVar1;
  int iVar2;
  int iVar3;
  int32_t month;
  int local_30;
  int32_t local_2c;
  
  Convert(date,year,&local_2c,&local_30);
  dVar1 = GetISOWeekOne(*year);
  iVar2 = date.days - dVar1.days;
  iVar3 = iVar2 % 7;
  local_30 = iVar2 % 7 + 7;
  if (-1 < iVar3) {
    local_30 = iVar3;
  }
  iVar2 = (iVar3 >> 0x1f) + iVar2 / 7;
  if (iVar2 < 0) {
    iVar2 = *year;
    *year = iVar2 + -1;
    dVar1 = GetISOWeekOne(iVar2 + -1);
    iVar2 = (date.days - dVar1.days) / 7;
    if ((date.days - dVar1.days) % 7 < 0) {
      iVar2 = iVar2 + -1;
    }
  }
  else if (0x33 < iVar2) {
    dVar1 = GetISOWeekOne(*year + 1);
    if (dVar1.days <= date.days) {
      *year = *year + 1;
      iVar2 = 0;
    }
  }
  *week = iVar2 + 1;
  return;
}

Assistant:

void Date::ExtractISOYearWeek(date_t date, int32_t &year, int32_t &week) {
	week = GetISOYearWeek(date, year);
}